

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O2

UChar * u_strFindLast_63(UChar *s,int32_t length,UChar *sub,int32_t subLength)

{
  UChar c;
  long lVar1;
  long lVar2;
  UBool UVar3;
  UChar *pUVar4;
  long lVar5;
  UChar *matchLimit;
  long lVar6;
  UChar *match;
  
  if (-2 < subLength && sub != (UChar *)0x0) {
    if (-2 < length && s != (UChar *)0x0) {
      if (subLength < 0) {
        subLength = u_strlen_63(sub);
      }
      if (subLength == 0) {
        return s;
      }
      lVar6 = (long)subLength;
      c = sub[lVar6 + -1];
      if ((subLength + -1 == 0) && ((c & 0xf800U) != 0xd800)) {
        if (-1 < length) {
          pUVar4 = u_memrchr_63(s,c,length);
          return pUVar4;
        }
        pUVar4 = u_strrchr_63(s,c);
        return pUVar4;
      }
      if (length < 0) {
        length = u_strlen_63(s);
      }
      if (subLength <= length) {
        pUVar4 = s + length;
        do {
          matchLimit = pUVar4;
          if (s + (subLength + -1) == matchLimit) break;
          pUVar4 = matchLimit + -1;
          if (matchLimit[-1] == c) {
            lVar5 = 0;
            do {
              if (lVar6 * -2 + 2 == lVar5) {
                match = (UChar *)((long)matchLimit + lVar5 + -2);
                UVar3 = isMatchAtCPBoundary(s,match,matchLimit,s + length);
                if (UVar3 != '\0') {
                  return match;
                }
                break;
              }
              lVar2 = lVar5 + -4;
              lVar1 = lVar5 + lVar6 * 2 + -4;
              lVar5 = lVar5 + -2;
            } while (*(short *)((long)matchLimit + lVar2) == *(short *)((long)sub + lVar1));
          }
        } while( true );
      }
    }
    s = (UChar *)0x0;
  }
  return s;
}

Assistant:

U_CAPI UChar * U_EXPORT2
u_strFindLast(const UChar *s, int32_t length,
              const UChar *sub, int32_t subLength) {
    const UChar *start, *limit, *p, *q, *subLimit;
    UChar c, cs;

    if(sub==NULL || subLength<-1) {
        return (UChar *)s;
    }
    if(s==NULL || length<-1) {
        return NULL;
    }

    /*
     * This implementation is more lazy than the one for u_strFindFirst():
     * There is no special search code for NUL-terminated strings.
     * It does not seem to be worth it for searching substrings to
     * search forward and find all matches like in u_strrchr() and similar.
     * Therefore, we simply get both string lengths and search backward.
     *
     * markus 2002oct23
     */

    if(subLength<0) {
        subLength=u_strlen(sub);
    }
    if(subLength==0) {
        return (UChar *)s;
    }

    /* get sub[subLength-1] to search for it fast */
    subLimit=sub+subLength;
    cs=*(--subLimit);
    --subLength;

    if(subLength==0 && !U16_IS_SURROGATE(cs)) {
        /* the substring consists of a single, non-surrogate BMP code point */
        return length<0 ? u_strrchr(s, cs) : u_memrchr(s, cs, length);
    }

    if(length<0) {
        length=u_strlen(s);
    }

    /* subLength was decremented above */
    if(length<=subLength) {
        return NULL; /* s is shorter than sub */
    }

    start=s;
    limit=s+length;

    /* the substring must start no later than s+subLength */
    s+=subLength;

    while(s!=limit) {
        c=*(--limit);
        if(c==cs) {
            /* found last substring UChar, compare rest */
            p=limit;
            q=subLimit;
            for(;;) {
                if(q==sub) {
                    if(isMatchAtCPBoundary(start, p, limit+1, start+length)) {
                        return (UChar *)p; /* well-formed match */
                    } else {
                        break; /* no match because surrogate pair is split */
                    }
                }
                if(*(--p)!=*(--q)) {
                    break; /* no match */
                }
            }
        }
    }

    /* not found */
    return NULL;
}